

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void __thiscall FWeaponSlots::PrintSettings(FWeaponSlots *this)

{
  int j;
  long lVar1;
  int i;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  for (uVar2 = 1; uVar2 != 0xb; uVar2 = uVar2 + 1) {
    uVar3 = (ulong)uVar2;
    if (uVar2 == 10) {
      uVar3 = 0;
    }
    if (0 < (int)this->Slots[uVar3].Weapons.Count) {
      Printf("Slot[%d]=");
      lVar4 = 0;
      for (lVar1 = 0; lVar1 < (int)this->Slots[uVar3].Weapons.Count; lVar1 = lVar1 + 1) {
        Printf("%s ",FName::NameData.NameArray
                     [*(int *)(*(long *)((long)&(this->Slots[uVar3].Weapons.Array)->Type + lVar4) +
                              0x88)].Text);
        lVar4 = lVar4 + 0x10;
      }
      Printf("\n");
    }
  }
  return;
}

Assistant:

void FWeaponSlots::PrintSettings()
{
	for (int i = 1; i <= NUM_WEAPON_SLOTS; ++i)
	{
		int slot = i % NUM_WEAPON_SLOTS;
		if (Slots[slot].Size() > 0)
		{
			Printf("Slot[%d]=", slot);
			for (int j = 0; j < Slots[slot].Size(); ++j)
			{
				Printf("%s ", Slots[slot].GetWeapon(j)->TypeName.GetChars());
			}
			Printf("\n");
		}
	}
}